

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O0

void __thiscall
QWidgetLineControl::draw
          (QWidgetLineControl *this,QPainter *painter,QPoint *offset,QRect *clip,int flags)

{
  QRect *r;
  QPoint *p;
  QRectF *in_RSI;
  QWidgetLineControl *in_RDI;
  uint in_R8D;
  long in_FS_OFFSET;
  int cursor;
  QList<QTextLayout::FormatRange> selections;
  FormatRange o;
  parameter_type in_stack_ffffffffffffff18;
  ColorRole cr;
  QPalette *in_stack_ffffffffffffff20;
  QTextFormat *in_stack_ffffffffffffff28;
  QRectF *this_00;
  int local_a0;
  undefined1 local_78 [48];
  undefined1 local_48 [16];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QList<QTextLayout::FormatRange>::QList((QList<QTextLayout::FormatRange> *)0x5dddd9);
  if ((in_R8D & 2) != 0) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QTextLayout::FormatRange::FormatRange((FormatRange *)0x5dde23);
    cr = (ColorRole)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    if (*(int *)(in_RDI + 0x110) < *(int *)(in_RDI + 0x114)) {
      local_20 = (undefined1 *)
                 CONCAT44(*(int *)(in_RDI + 0x114) - *(int *)(in_RDI + 0x110),
                          *(undefined4 *)(in_RDI + 0x110));
      QPalette::brush(in_stack_ffffffffffffff20,cr);
      QTextFormat::setBackground(in_stack_ffffffffffffff28,(QBrush *)in_stack_ffffffffffffff20);
      QPalette::brush(in_stack_ffffffffffffff20,
                      (ColorRole)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      QTextFormat::setForeground(in_stack_ffffffffffffff28,(QBrush *)in_stack_ffffffffffffff20);
    }
    else if ((*(ushort *)(in_RDI + 0x50) >> 9 & 1) != 0) {
      local_20 = (undefined1 *)CONCAT44(1,*(undefined4 *)(in_RDI + 0x40));
      QPalette::brush(in_stack_ffffffffffffff20,cr);
      QTextFormat::setBackground(in_stack_ffffffffffffff28,(QBrush *)in_stack_ffffffffffffff20);
      QPalette::brush(in_stack_ffffffffffffff20,
                      (ColorRole)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      QTextFormat::setForeground(in_stack_ffffffffffffff28,(QBrush *)in_stack_ffffffffffffff20);
    }
    QList<QTextLayout::FormatRange>::append
              ((QList<QTextLayout::FormatRange> *)in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18);
    QTextLayout::FormatRange::~FormatRange((FormatRange *)0x5ddf75);
  }
  if ((in_R8D & 1) != 0) {
    r = (QRect *)textLayout(in_RDI);
    this_00 = in_RSI;
    QPointF::QPointF((QPointF *)in_stack_ffffffffffffff20,(QPoint *)in_stack_ffffffffffffff18);
    QRectF::QRectF(this_00,r);
    QTextLayout::draw((QPainter *)r,(QPointF *)this_00,(QList_conflict2 *)local_48,
                      (QRectF *)&local_38);
  }
  if ((in_R8D & 4) != 0) {
    local_a0 = *(int *)(in_RDI + 0x40);
    if (*(int *)(in_RDI + 0x44) != -1) {
      local_a0 = *(int *)(in_RDI + 0x44) + local_a0;
    }
    if (((*(ushort *)(in_RDI + 0x50) & 1) == 0) && ((*(ushort *)(in_RDI + 0x50) >> 9 & 1) != 0)) {
      p = (QPoint *)textLayout(in_RDI);
      QPointF::QPointF((QPointF *)in_RSI,p);
      QTextLayout::drawCursor((QPainter *)p,(QPointF *)in_RSI,(int)local_78,local_a0);
    }
  }
  QList<QTextLayout::FormatRange>::~QList((QList<QTextLayout::FormatRange> *)0x5de09b);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetLineControl::draw(QPainter *painter, const QPoint &offset, const QRect &clip, int flags)
{
    QList<QTextLayout::FormatRange> selections;
    if (flags & DrawSelections) {
        QTextLayout::FormatRange o;
        if (m_selstart < m_selend) {
            o.start = m_selstart;
            o.length = m_selend - m_selstart;
            o.format.setBackground(m_palette.brush(QPalette::Highlight));
            o.format.setForeground(m_palette.brush(QPalette::HighlightedText));
        } else {
            // mask selection
            if (m_blinkStatus){
                o.start = m_cursor;
                o.length = 1;
                o.format.setBackground(m_palette.brush(QPalette::Text));
                o.format.setForeground(m_palette.brush(QPalette::Window));
            }
        }
        selections.append(o);
    }

    if (flags & DrawText)
        textLayout()->draw(painter, offset, selections, clip);

    if (flags & DrawCursor){
        int cursor = m_cursor;
        if (m_preeditCursor != -1)
            cursor += m_preeditCursor;
        if (!m_hideCursor && m_blinkStatus)
            textLayout()->drawCursor(painter, offset, cursor, m_cursorWidth);
    }
}